

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O2

string * dg::vr::strip(string *__return_storage_ptr__,string *str,size_t skipSpaces)

{
  long lVar1;
  long lVar2;
  
  lVar2 = skipSpaces + 1;
  do {
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
      return __return_storage_ptr__;
    }
    lVar1 = std::__cxx11::string::find((char)str,0x20);
  } while (lVar1 != -1);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

std::string strip(std::string str, size_t skipSpaces) {
    assert(!str.empty() && !std::isspace(str[0]));

    size_t lastIndex = 0;
    for (size_t i = 0; i < skipSpaces; ++i) {
        size_t nextIndex = str.find(' ', lastIndex + 1);
        if (nextIndex == std::string::npos)
            return str;
        lastIndex = nextIndex;
    }
    return str.substr(0, lastIndex);
}